

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::setWindowTitle_sys(QWidgetPrivate *this,QString *caption)

{
  QObject *pQVar1;
  storage_type_conflict *psVar2;
  QObject *pQVar3;
  char cVar4;
  byte bVar5;
  long lVar6;
  long *plVar7;
  QString *pQVar8;
  QArrayData *pQVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QArrayData *local_70;
  storage_type_conflict *local_68;
  QObject *local_60;
  QArrayData *local_58;
  storage_type_conflict *psStack_50;
  QObject *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((*(byte *)(*(long *)(pQVar1 + 0x20) + 0xc) & 1) != 0) {
    if (*(long *)(*(long *)(pQVar1 + 8) + 0x78) == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)(*(long *)(*(long *)(pQVar1 + 8) + 0x78) + 8);
    }
    if (lVar6 == 0) {
      pQVar8 = (QString *)0x0;
    }
    else {
      pQVar8 = *(QString **)(lVar6 + 0x20);
    }
    if (pQVar8 != (QString *)0x0) {
      cVar4 = QAccessible::isActive();
      if (cVar4 == '\0') {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)QAccessible::queryAccessibleInterface(pQVar1);
      }
      if (plVar7 == (long *)0x0) {
        QWindow::setTitle(pQVar8);
        pQVar9 = (QArrayData *)0x0;
        bVar5 = 0;
      }
      else {
        (**(code **)(*plVar7 + 0x60))(&local_58,plVar7,0);
        pQVar3 = local_48;
        psVar2 = psStack_50;
        pQVar9 = local_58;
        QWindow::setTitle(pQVar8);
        (**(code **)(*plVar7 + 0x60))(&local_70,plVar7,0);
        bVar5 = 1;
        if (local_60 == pQVar3) {
          QVar10.m_data = local_68;
          QVar10.m_size = (qsizetype)local_60;
          QVar11.m_data = psVar2;
          QVar11.m_size = (qsizetype)pQVar3;
          bVar5 = QtPrivate::equalStrings(QVar10,QVar11);
          bVar5 = bVar5 ^ 1;
        }
      }
      if ((plVar7 != (long *)0x0) && (local_70 != (QArrayData *)0x0)) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,0x10);
        }
      }
      if (bVar5 != 0) {
        local_58 = (QArrayData *)QFont::strikeOut;
        psStack_50 = (storage_type_conflict *)0xaaaaaaaa0000800c;
        uStack_40 = 0xaaaaaaaaffffffff;
        local_48 = pQVar1;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
        QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
      }
      if (pQVar9 != (QArrayData *)0x0) {
        LOCK();
        (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar9,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWindowTitle_sys(const QString &caption)
{
    Q_Q(QWidget);
    if (!q->isWindow())
        return;

    if (QWindow *window = q->windowHandle())
    {
#if QT_CONFIG(accessibility)
        QString oldAccessibleName;
        const QAccessibleInterface *accessible = QAccessible::isActive()
                                               ? QAccessible::queryAccessibleInterface(q)
                                               : nullptr;
        if (accessible)
            oldAccessibleName = accessible->text(QAccessible::Name);
#endif

        window->setTitle(caption);

#if QT_CONFIG(accessibility)
        if (accessible && accessible->text(QAccessible::Name) != oldAccessibleName) {
            QAccessibleEvent event(q, QAccessible::NameChanged);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}